

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> __thiscall
node::anon_unknown_2::MinerImpl::createNewBlock
          (MinerImpl *this,CScript *script_pub_key,BlockCreateOptions *options)

{
  ArgsManager **ppAVar1;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar2;
  Chainstate *chainstate;
  long lVar3;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  Options assemble_options;
  BlockAssembler local_130;
  Options local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.super_BlockCreateOptions.coinbase_output_max_additional_sigops = in_RCX[2];
  local_68.super_BlockCreateOptions._0_8_ = *in_RCX;
  local_68.super_BlockCreateOptions.coinbase_max_additional_weight = in_RCX[1];
  local_68.nBlockMaxWeight = 0x3cf960;
  local_68.blockMinFeeRate.nSatoshisPerK = 1000;
  local_68.test_block_validity = true;
  local_68.print_modified_fee = false;
  ppAVar1 = inline_assertion_check<true,ArgsManager*&>
                      ((ArgsManager **)
                       (*(long *)((long)&(script_pub_key->super_CScriptBase)._union + 8) + 0x60),
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x393,"createNewBlock","m_node.args");
  ApplyArgsManOptions(*ppAVar1,&local_68);
  puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      (*(long *)((long)&(script_pub_key->super_CScriptBase)._union + 8) + 0x50),
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x398,"chainman","m_node.chainman");
  chainstate = ChainstateManager::ActiveChainstate
                         ((puVar2->_M_t).
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  lVar3 = (**(code **)((script_pub_key->super_CScriptBase)._union.indirect_contents.indirect + 0x48)
          )(script_pub_key);
  BlockAssembler::BlockAssembler(&local_130,chainstate,*(CTxMemPool **)(lVar3 + 0x30),&local_68);
  BlockAssembler::CreateNewBlock((BlockAssembler *)this,(CScript *)&local_130);
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_130.inBlock._M_h);
  if ((_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
      local_130.pblocktemplate._M_t.
      super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
      super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
      super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)&local_130,
               (CBlockTemplate *)
               local_130.pblocktemplate._M_t.
               super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
               ._M_t.
               super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
               .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
            )(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CBlockTemplate> createNewBlock(const CScript& script_pub_key, const BlockCreateOptions& options) override
    {
        BlockAssembler::Options assemble_options{options};
        ApplyArgsManOptions(*Assert(m_node.args), assemble_options);
        return BlockAssembler{chainman().ActiveChainstate(), context()->mempool.get(), assemble_options}.CreateNewBlock(script_pub_key);
    }